

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Box.H
# Opt level: O0

bool __thiscall amrex::Box::ok(Box *this)

{
  bool bVar1;
  bool local_69;
  Box *this_local;
  
  bVar1 = false;
  if (((this->smallend).vect[0] <= (this->bigend).vect[0]) &&
     (bVar1 = false, (this->smallend).vect[1] <= (this->bigend).vect[1])) {
    bVar1 = (this->smallend).vect[2] <= (this->bigend).vect[2];
  }
  local_69 = false;
  if (bVar1) {
    local_69 = (this->btype).itype < 8;
  }
  return local_69;
}

Assistant:

AMREX_GPU_HOST_DEVICE
    bool ok () const noexcept { return bigend.allGE(smallend) && btype.ok(); }